

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O1

void __thiscall FlasherInfo::print(FlasherInfo *this)

{
  bool bVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar3 = 0;
  printf("Device       : %s\n",(this->name)._M_dataplus._M_p);
  printf("Version      : %s\n",(this->version)._M_dataplus._M_p);
  printf("Address      : 0x%x\n",(ulong)this->address);
  printf("Pages        : %d\n",(ulong)this->numPages);
  printf("Page Size    : %d bytes\n",(ulong)this->pageSize);
  printf("Total Size   : %dKB\n",(ulong)(this->totalSize >> 10));
  printf("Planes       : %d\n",(ulong)this->numPlanes);
  printf("Lock Regions : %zd\n",
         (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         ((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  printf("Locked       : ");
  p_Var2 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8 +
      (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
    pcVar5 = "none";
  }
  else {
    bVar1 = true;
    pcVar5 = "";
    do {
      if ((p_Var2[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        pcVar4 = ",";
        if (bVar1) {
          pcVar4 = "";
        }
        bVar1 = false;
        printf("%s%d",pcVar4,uVar3);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
      p_Var2 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while (uVar3 < (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var2) * 8);
    if (bVar1) {
      pcVar5 = "none";
    }
  }
  puts(pcVar5);
  pcVar4 = "false";
  pcVar5 = "false";
  if (this->security != false) {
    pcVar5 = "true";
  }
  printf("Security     : %s\n",pcVar5);
  if (this->canBootFlash != false) {
    pcVar5 = "false";
    if (this->bootFlash != false) {
      pcVar5 = "true";
    }
    printf("Boot Flash   : %s\n",pcVar5);
  }
  if (this->canBod == true) {
    pcVar5 = "false";
    if (this->bod != false) {
      pcVar5 = "true";
    }
    printf("BOD          : %s\n",pcVar5);
  }
  if (this->canBor == true) {
    if (this->bor != false) {
      pcVar4 = "true";
    }
    printf("BOR          : %s\n",pcVar4);
    return;
  }
  return;
}

Assistant:

void
FlasherInfo::print()
{
    bool first;

    printf("Device       : %s\n", name.c_str());
    printf("Version      : %s\n", version.c_str());
    printf("Address      : 0x%x\n", address);
    printf("Pages        : %d\n", numPages);
    printf("Page Size    : %d bytes\n", pageSize);
    printf("Total Size   : %dKB\n", totalSize / 1024);
    printf("Planes       : %d\n", numPlanes);
    printf("Lock Regions : %zd\n", lockRegions.size());
    printf("Locked       : ");
    first = true;
    for (uint32_t region = 0; region < lockRegions.size(); region++)
    {
        if (lockRegions[region])
        {
            printf("%s%d", first ? "" : ",", region);
            first = false;
        }
    }
    printf("%s\n", first ? "none" : "");
    printf("Security     : %s\n", security ? "true" : "false");
    if (canBootFlash)
        printf("Boot Flash   : %s\n", bootFlash ? "true" : "false");
    if (canBod)
        printf("BOD          : %s\n", bod ? "true" : "false");
    if (canBor)
        printf("BOR          : %s\n", bor ? "true" : "false");
}